

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::async_get
          (coro_http_client *this,string *uri,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers)

{
  __node_base *p_Var1;
  __buckets_ptr pp_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_type sVar5;
  element_type *peVar6;
  char **ppcVar7;
  
  peVar6 = (element_type *)operator_new(0x318,(nothrow_t *)&std::nothrow);
  if (peVar6 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar6->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> = async_get;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar6->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)async_get;
    (((http_header *)((long)(peVar6->parser_).headers_._M_elems + 0x2c0))->name)._M_len =
         (size_t)uri;
    ppcVar7 = (char **)((long)(peVar6->parser_).headers_._M_elems + 0x238);
    *(char ***)((long)(peVar6->parser_).headers_._M_elems + 0x228) = ppcVar7;
    pp_Var2 = (headers->_M_h)._M_buckets;
    p_Var1 = &(headers->_M_h)._M_before_begin;
    if ((__node_base *)pp_Var2 == p_Var1) {
      uVar3 = *(undefined4 *)((long)&(headers->_M_h)._M_before_begin._M_nxt + 4);
      sVar5 = (headers->_M_h)._M_element_count;
      uVar4 = *(undefined4 *)((long)&(headers->_M_h)._M_element_count + 4);
      *(undefined4 *)ppcVar7 = *(undefined4 *)&p_Var1->_M_nxt;
      *(undefined4 *)((long)(peVar6->parser_).headers_._M_elems + 0x23c) = uVar3;
      *(int *)&(((http_header *)((long)(peVar6->parser_).headers_._M_elems + 0x240))->name)._M_len =
           (int)sVar5;
      *(undefined4 *)((long)(peVar6->parser_).headers_._M_elems + 0x244) = uVar4;
    }
    else {
      *(__buckets_ptr *)((long)(peVar6->parser_).headers_._M_elems + 0x228) = pp_Var2;
      *(_Hash_node_base **)((long)(peVar6->parser_).headers_._M_elems + 0x238) = p_Var1->_M_nxt;
    }
    ((string_view *)((long)(peVar6->parser_).headers_._M_elems + 0x230))->_M_len =
         (headers->_M_h)._M_bucket_count;
    (headers->_M_h)._M_buckets = &p_Var1->_M_nxt;
    (headers->_M_h)._M_bucket_count = 0;
    *(undefined1 *)&(headers->_M_h)._M_before_begin._M_nxt = 0;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)(peVar6->parser_).headers_._M_elems + 0x110));
    (peVar6->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar6->parser_ = 0;
    (peVar6->parser_).msg_._M_len = 0;
    *(undefined1 *)((long)(peVar6->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
    *(undefined1 *)((long)(peVar6->parser_).headers_._M_elems + 0x2c8) = 0;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_get(
      std::string uri,
      std::unordered_map<std::string, std::string> headers = {}) {
    resp_data data{};
    req_context<> ctx{};
    data = co_await async_request(std::move(uri), http_method::GET,
                                  std::move(ctx), std::move(headers));
#ifdef BENCHMARK_TEST
    data.total = total_len_;
#endif
    if (redirect_uri_.empty() || !is_redirect(data)) {
      co_return data;
    }
    else {
      if (enable_follow_redirect_)
        data = co_await async_request(std::move(redirect_uri_),
                                      http_method::GET, std::move(ctx));
      co_return data;
    }
  }